

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_repair_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,double intensity,int ratio)

{
  double *pdVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pair<int,_int> pVar6;
  uint uVar7;
  int j;
  long lVar8;
  ulong uVar9;
  int i;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  int local_38;
  
  increaseIntensity_abi_cxx11_(__return_storage_ptr__,this,beam,intensity,ratio);
  pVar6 = getPos(this,beam);
  if (intensity <= 0.0) {
    for (lVar10 = 0; iVar4 = Collimator::getXdim(this->collimator), lVar10 < iVar4;
        lVar10 = lVar10 + 1) {
      iVar4 = Collimator::getYdim(this->collimator);
      local_38 = pVar6.second;
      if (local_38 < iVar4 / 2) {
        uVar7 = Collimator::getYdim(this->collimator);
        if ((int)uVar7 < 1) {
          iVar4 = 0;
        }
        else {
          iVar4 = 0;
          dVar12 = -1.0;
          uVar9 = (ulong)uVar7;
          do {
            dVar13 = (this->I).p[lVar10][uVar9 - 1];
            iVar5 = (int)(uVar9 - 1);
            if (dVar13 <= dVar12) {
              dVar13 = dVar12;
              iVar5 = iVar4;
            }
            iVar4 = iVar5;
            dVar12 = dVar13;
            bVar2 = 1 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar2);
        }
      }
      else {
        iVar4 = 0;
        dVar12 = -1.0;
        for (lVar8 = 0; iVar5 = Collimator::getYdim(this->collimator), lVar8 < iVar5;
            lVar8 = lVar8 + 1) {
          dVar13 = (this->I).p[lVar10][lVar8];
          iVar5 = (int)lVar8;
          if (dVar13 <= dVar12) {
            dVar13 = dVar12;
            iVar5 = iVar4;
          }
          iVar4 = iVar5;
          dVar12 = dVar13;
        }
      }
      lVar11 = (long)iVar4 + 1;
      lVar8 = lVar11;
      while( true ) {
        iVar5 = Collimator::getYdim(this->collimator);
        if (iVar5 <= lVar8) break;
        pdVar1 = (this->I).p[lVar10];
        dVar12 = pdVar1[lVar8 + -1];
        if (dVar12 < pdVar1[lVar8]) {
          change_intensity(this,(int)lVar10,(int)lVar8,dVar12,__return_storage_ptr__);
        }
        lVar8 = lVar8 + 1;
      }
      if (0 < iVar4) {
        do {
          iVar4 = iVar4 + -1;
          pdVar1 = (this->I).p[lVar10];
          dVar12 = pdVar1[lVar11 + -1];
          if (dVar12 < pdVar1[lVar11 + -2]) {
            change_intensity(this,(int)lVar10,iVar4,dVar12,__return_storage_ptr__);
          }
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
      }
    }
  }
  else {
    for (lVar10 = 0; iVar4 = Collimator::getXdim(this->collimator), lVar10 < iVar4;
        lVar10 = lVar10 + 1) {
      uVar7 = 0;
      dVar12 = -1.0;
      for (lVar8 = 0; iVar4 = Collimator::getYdim(this->collimator), lVar8 < iVar4;
          lVar8 = lVar8 + 1) {
        dVar13 = (this->I).p[lVar10][lVar8];
        uVar3 = (uint)lVar8;
        if (dVar13 <= dVar12) {
          dVar13 = dVar12;
          uVar3 = uVar7;
        }
        uVar7 = uVar3;
        dVar12 = dVar13;
      }
      if (1 < (int)uVar7) {
        uVar9 = 1;
        do {
          pdVar1 = (this->I).p[lVar10];
          dVar12 = pdVar1[uVar9 - 1];
          pdVar1 = pdVar1 + uVar9;
          if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) {
            change_intensity(this,(int)lVar10,(int)uVar9,dVar12,__return_storage_ptr__);
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      iVar4 = Collimator::getYdim(this->collimator);
      if ((int)uVar7 < iVar4 + -2) {
        lVar8 = (long)(iVar4 + -2);
        do {
          pdVar1 = (this->I).p[lVar10];
          dVar12 = pdVar1[lVar8 + 1];
          pdVar1 = pdVar1 + lVar8;
          if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) {
            change_intensity(this,(int)lVar10,(int)lVar8,dVar12,__return_storage_ptr__);
          }
          lVar8 = lVar8 + -1;
        } while ((int)uVar7 < lVar8);
      }
    }
  }
  while ((ulong)(long)this->max_apertures <
         (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    reduce_apertures(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity_repair(int beam, double intensity, int ratio){
    list< pair< int, double > > diff=increaseIntensity(beam, intensity, ratio);

    pair<int,int> p = getPos(beam);
    int x=p.first, y=p.second;

    if(intensity > 0.0) //reparation (phase 1A)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;
      for(int j=0; j<collimator.getYdim(); j++)
         if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}

      for(int j=1; j<max_j; j++)
        if(I(i,j) < I(i,j-1))
            change_intensity(i, j, I(i,j-1), &diff);

      for(int j=collimator.getYdim()-2; j>max_j; j--)
        if(I(i,j) < I(i,j+1))
             change_intensity(i, j, I(i,j+1), &diff);
    }

    else //reparation (phase 1B)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;

      if(y<collimator.getYdim()/2){
        for(int j=collimator.getYdim()-1; j>=0; j--)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }else{
        for(int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }

      for(int j=max_j+1; j<collimator.getYdim(); j++)
        if(I(i,j) > I(i,j-1))
             change_intensity(i, j, I(i,j-1), &diff);

      for(int j=max_j-1; j>=0; j--)
        if(I(i,j) > I(i,j+1))
              change_intensity(i, j, I(i,j+1), &diff);
    }

    //reparation (phase 2)
    while(int2nb.size()>max_apertures)
    	reduce_apertures(diff);


    return diff;
  }